

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTargetInternals::AddInterfaceEntries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,string *prop,
          vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          *entries)

{
  pointer *__rhs;
  pointer *pppTVar1;
  pointer pcVar2;
  iterator __position;
  cmListFileBacktrace *pcVar3;
  auto_ptr<cmCompiledGeneratorExpression> aVar4;
  LinkImplementationLibraries *pLVar5;
  long *plVar6;
  cmCompiledGeneratorExpression *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  cmGeneratorExpressionEvaluator **ppcVar9;
  cmCompiledGeneratorExpression *x;
  cmListFileBacktrace *backtrace;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string genex;
  auto_ptr<cmCompiledGeneratorExpression> local_c8;
  long local_c0;
  undefined1 local_b8 [24];
  cmState *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  cmGeneratorExpressionEvaluator **local_88;
  pointer local_80;
  cmGeneratorExpressionEvaluator *local_78;
  _Alloc_hider _Stack_70;
  auto_ptr<cmCompiledGeneratorExpression> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string *local_40;
  pointer local_38;
  
  local_40 = prop;
  pLVar5 = cmTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,thisTarget);
  if (pLVar5 != (LinkImplementationLibraries *)0x0) {
    pcVar2 = (pLVar5->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (pLVar5->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (pcVar2 != local_38) {
      backtrace = &pcVar2->Backtrace;
      do {
        if (backtrace[-1].Snapshot.Position.Position != 0) {
          __rhs = &backtrace[-1].super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>
                   .super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_60,"$<TARGET_PROPERTY:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          plVar6 = (long *)std::__cxx11::string::append(local_60._M_local_buf);
          local_c8.x_ = (cmCompiledGeneratorExpression *)local_b8;
          pcVar7 = (cmCompiledGeneratorExpression *)(plVar6 + 2);
          if ((cmCompiledGeneratorExpression *)*plVar6 == pcVar7) {
            local_b8._0_8_ =
                 (pcVar7->Backtrace).
                 super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
                 super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_b8._8_8_ = plVar6[3];
          }
          else {
            local_b8._0_8_ =
                 (pcVar7->Backtrace).
                 super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
                 super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_c8.x_ = (cmCompiledGeneratorExpression *)*plVar6;
          }
          local_c0 = plVar6[1];
          *plVar6 = (long)pcVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_c8,(ulong)(local_40->_M_dataplus)._M_p);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar8) {
            local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_98._8_8_ = plVar6[3];
            local_b8._16_8_ = &local_98;
          }
          else {
            local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_b8._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
          }
          local_a0 = (cmState *)plVar6[1];
          *plVar6 = (long)paVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_b8 + 0x10);
          ppcVar9 = (cmGeneratorExpressionEvaluator **)(plVar6 + 2);
          if ((cmGeneratorExpressionEvaluator **)*plVar6 == ppcVar9) {
            local_78 = *ppcVar9;
            _Stack_70._M_p = (pointer)plVar6[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *ppcVar9;
            local_88 = (cmGeneratorExpressionEvaluator **)*plVar6;
          }
          local_80 = (pointer)plVar6[1];
          *plVar6 = (long)ppcVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._16_8_ != &local_98) {
            operator_delete((void *)local_b8._16_8_,local_98._M_allocated_capacity + 1);
          }
          if (local_c8.x_ != (cmCompiledGeneratorExpression *)local_b8) {
            operator_delete(local_c8.x_,
                            (ulong)((long)&(((string *)local_b8._0_8_)->_M_dataplus)._M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_allocated_capacity != &local_50) {
            operator_delete((void *)local_60._M_allocated_capacity,
                            local_50._M_allocated_capacity + 1);
          }
          cmGeneratorExpression::cmGeneratorExpression
                    ((cmGeneratorExpression *)(local_b8 + 0x10),backtrace);
          cmGeneratorExpression::Parse
                    ((cmGeneratorExpression *)&local_60._M_allocated_capacity,
                     (string *)(local_b8 + 0x10));
          local_c8.x_ = (cmCompiledGeneratorExpression *)local_60._M_allocated_capacity;
          local_60._M_allocated_capacity = 0;
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_60._M_allocated_capacity);
          aVar4.x_ = local_c8.x_;
          (local_c8.x_)->EvaluateForBuildsystem = true;
          local_60._M_allocated_capacity = (size_type)operator_new(0x10);
          local_c8.x_ = (cmCompiledGeneratorExpression *)0x0;
          local_68.x_ = (cmCompiledGeneratorExpression *)0x0;
          *(cmCompiledGeneratorExpression **)local_60._M_allocated_capacity = aVar4.x_;
          *(pointer **)(local_60._M_allocated_capacity + 8) = __rhs;
          __position._M_current =
               (entries->
               super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (entries->
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
            ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                      ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                        *)entries,__position,(TargetPropertyEntry **)&local_60._M_allocated_capacity
                      );
          }
          else {
            *__position._M_current = (TargetPropertyEntry *)local_60._M_allocated_capacity;
            pppTVar1 = &(entries->
                        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_68);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_c8);
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_b8 + 0x10));
          if (local_88 != &local_78) {
            operator_delete(local_88,(ulong)((long)&local_78->_vptr_cmGeneratorExpressionEvaluator +
                                            1));
          }
        }
        pcVar3 = backtrace + 1;
        backtrace = backtrace + 2;
      } while ((pointer)&(pcVar3->
                         super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>).
                         super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                         _M_impl.super__Vector_impl_data._M_finish != local_38);
    }
  }
  return;
}

Assistant:

void cmTargetInternals::AddInterfaceEntries(
  cmTarget const* thisTarget, std::string const& config,
  std::string const& prop, std::vector<TargetPropertyEntry*>& entries)
{
  if(cmTarget::LinkImplementationLibraries const* impl =
     thisTarget->GetLinkImplementationLibraries(config))
    {
    for (std::vector<cmLinkImplItem>::const_iterator
           it = impl->Libraries.begin(), end = impl->Libraries.end();
         it != end; ++it)
      {
      if(it->Target)
        {
        std::string genex =
          "$<TARGET_PROPERTY:" + *it + "," + prop + ">";
        cmGeneratorExpression ge(&it->Backtrace);
        cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(
          new cmTargetInternals::TargetPropertyEntry(cge, *it));
        }
      }
    }
}